

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O2

void __thiscall seq_precede_inc::~seq_precede_inc(seq_precede_inc *this)

{
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__seq_precede_inc_001f0c50;
  vec<int>::~vec(&this->limit_change);
  vec<int>::~vec(&this->first_change);
  vec<Tint>::~vec(&this->limit_val);
  vec<Tint>::~vec(&this->first_val);
  vec<Tint>::~vec(&this->limit);
  vec<Tint>::~vec(&this->first);
  vec<IntVar_*>::~vec(&this->xs);
  return;
}

Assistant:

Clause* ex_ub(int xi, int k) {
		Clause* r = Reason_new(xi + 1);

		// One of the predecessors must be (at least) k.
		for (int ii = 0; ii < xi; ++ii) {
			(*r)[ii + 1] = xs[ii]->getLit(k, LR_GE);
		}
		return r;
	}